

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_constant_composite_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,SPIRConstant *c,
          uint32_t *chain,uint32_t length)

{
  Constant *pCVar1;
  ID *pIVar2;
  uint uVar3;
  bool bVar4;
  SPIRType *type;
  SPIRConstant tmp;
  undefined1 local_198 [328];
  _Alloc_hider local_50;
  char local_40 [16];
  
  SPIRConstant::SPIRConstant((SPIRConstant *)local_198);
  local_198._12_4_ = result_type;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(c->super_IVariant).field_0xc);
  if ((*(int *)&(type->super_IVariant).field_0xc == 0xf) ||
     ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
    __assert_fail("composite_type.basetype != SPIRType::Struct && composite_type.array.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x1252,
                  "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                 );
  }
  if (c->specialization == true) {
    __assert_fail("!c.specialization",
                  "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x1253,
                  "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                 );
  }
  bVar4 = Compiler::is_matrix(&this->super_Compiler,type);
  if (bVar4) {
    if (length == 1) {
      uVar3 = *chain;
      local_198._64_4_ = (c->m).c[uVar3].vecsize;
      pCVar1 = (c->m).c[uVar3].r;
      local_198._16_8_ = *pCVar1;
      local_198._24_8_ = pCVar1[1];
      pCVar1 = (c->m).c[uVar3].r + 2;
      local_198._32_8_ = *pCVar1;
      local_198._40_8_ = pCVar1[1];
      pIVar2 = (c->m).c[uVar3].id;
      local_198._48_8_ = *(undefined8 *)pIVar2;
      local_198._56_8_ = *(undefined8 *)(pIVar2 + 2);
      goto LAB_001e646d;
    }
    if (length != 2) {
      __assert_fail("length == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x125f,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    local_198._16_8_ = (c->m).c[*chain].r[chain[1]];
  }
  else {
    if (length != 1) {
      __assert_fail("length == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp"
                    ,0x1267,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    local_198._16_8_ = (c->m).c[0].r[*chain];
  }
  local_198._64_4_ = 1;
LAB_001e646d:
  local_198._256_4_ = 1;
  constant_expression_abi_cxx11_(__return_storage_ptr__,this,(SPIRConstant *)local_198,false);
  local_198._0_8_ = &PTR__SPIRConstant_003d82a8;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  local_198._280_8_ = 0;
  if ((TypedID<(spirv_cross::Types)3> *)local_198._272_8_ !=
      (TypedID<(spirv_cross::Types)3> *)(local_198 + 0x128)) {
    free((void *)local_198._272_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_extract_constant_composite_expression(uint32_t result_type, const SPIRConstant &c,
                                                              const uint32_t *chain, uint32_t length)
{
	// It is kinda silly if application actually enter this path since they know the constant up front.
	// It is useful here to extract the plain constant directly.
	SPIRConstant tmp;
	tmp.constant_type = result_type;
	auto &composite_type = get<SPIRType>(c.constant_type);
	assert(composite_type.basetype != SPIRType::Struct && composite_type.array.empty());
	assert(!c.specialization);

	if (is_matrix(composite_type))
	{
		if (length == 2)
		{
			tmp.m.c[0].vecsize = 1;
			tmp.m.columns = 1;
			tmp.m.c[0].r[0] = c.m.c[chain[0]].r[chain[1]];
		}
		else
		{
			assert(length == 1);
			tmp.m.c[0].vecsize = composite_type.vecsize;
			tmp.m.columns = 1;
			tmp.m.c[0] = c.m.c[chain[0]];
		}
	}
	else
	{
		assert(length == 1);
		tmp.m.c[0].vecsize = 1;
		tmp.m.columns = 1;
		tmp.m.c[0].r[0] = c.m.c[0].r[chain[0]];
	}

	return constant_expression(tmp);
}